

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetFilenameComponentCommand.cxx
# Opt level: O2

bool __thiscall
cmGetFilenameComponentCommand::InitialPass
          (cmGetFilenameComponentCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  string *name;
  _Alloc_hider _Var3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  uint i;
  uint uVar9;
  string baseDir;
  string result;
  string storeArgs;
  string filename;
  string programArgs;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (uVar8 < 0x41) {
    std::__cxx11::string::string
              ((string *)&result,"called with incorrect number of arguments",(allocator *)&filename)
    ;
    cmCommand::SetError(&this->super_cmCommand,&result);
    std::__cxx11::string::~string((string *)&result);
    return false;
  }
  if ((((uVar8 != 0x60) &&
       (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)pbVar1 + (uVar8 - 0x20)),"CACHE"), bVar4)) &&
      (pcVar6 = cmMakefile::GetDefinition
                          ((this->super_cmCommand).Makefile,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start), pcVar6 != (char *)0x0)) &&
     (bVar4 = cmSystemTools::IsNOTFOUND((char *)0x305228), !bVar4)) {
    return true;
  }
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&filename,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 1));
  lVar7 = std::__cxx11::string::find((char *)&filename,0x48ebd4);
  uVar8 = 2;
  if (lVar7 != -1) {
    bVar4 = cmMakefile::PlatformIs64Bit((this->super_cmCommand).Makefile);
    cmSystemTools::ExpandRegistryValues(&filename,bVar4 + KeyWOW64_32);
    lVar7 = std::__cxx11::string::find((char *)&filename,0x481f54);
    if (lVar7 != -1) {
      std::__cxx11::string::string
                ((string *)&storeArgs,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 1));
      cmSystemTools::ExpandRegistryValues(&storeArgs,KeyWOW64_64 - bVar4);
      lVar7 = std::__cxx11::string::find((char *)&storeArgs,0x481f54);
      if (lVar7 == -1) {
        std::__cxx11::string::_M_assign((string *)&filename);
      }
      std::__cxx11::string::~string((string *)&storeArgs);
    }
  }
  storeArgs._M_dataplus._M_p = (pointer)&storeArgs.field_2;
  storeArgs._M_string_length = 0;
  programArgs._M_dataplus._M_p = (pointer)&programArgs.field_2;
  programArgs._M_string_length = 0;
  storeArgs.field_2._M_local_buf[0] = '\0';
  programArgs.field_2._M_local_buf[0] = '\0';
  bVar4 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 2,"DIRECTORY");
  if ((bVar4) ||
     (bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"PATH"), bVar4)) {
    cmsys::SystemTools::GetFilenamePath(&baseDir,&filename);
LAB_00305363:
    std::__cxx11::string::operator=((string *)&result,(string *)&baseDir);
LAB_00305378:
    std::__cxx11::string::~string((string *)&baseDir);
  }
  else {
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 2,"NAME");
    if (bVar4) {
      cmsys::SystemTools::GetFilenameName(&baseDir,&filename);
      goto LAB_00305363;
    }
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 2,"PROGRAM");
    if (!bVar4) {
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"EXT");
      if (bVar4) {
        cmsys::SystemTools::GetFilenameExtension(&baseDir,&filename);
        goto LAB_00305363;
      }
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"NAME_WE");
      if (bVar4) {
        cmsys::SystemTools::GetFilenameWithoutExtension(&baseDir,&filename);
        goto LAB_00305363;
      }
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"ABSOLUTE");
      if ((!bVar4) &&
         (bVar4 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 2,"REALPATH"), !bVar4
         )) {
        std::operator+(&baseDir,"unknown component ",
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 2);
        cmCommand::SetError(&this->super_cmCommand,&baseDir);
        std::__cxx11::string::~string((string *)&baseDir);
        bVar4 = false;
        goto LAB_0030547f;
      }
      pcVar6 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)&baseDir,pcVar6,(allocator *)&local_50);
      uVar8 = 3;
      while( true ) {
        uVar9 = (uint)uVar8;
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar8)
        break;
        bVar4 = std::operator==(pbVar1 + uVar8,"BASE_DIR");
        if ((bVar4) &&
           (uVar9 = uVar9 + 1,
           (ulong)uVar9 <
           (ulong)((long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 5))) {
          std::__cxx11::string::_M_assign((string *)&baseDir);
        }
        uVar8 = (ulong)(uVar9 + 1);
      }
      cmsys::SystemTools::CollapseFullPath(&local_50,&filename,&baseDir);
      std::__cxx11::string::operator=((string *)&result,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"REALPATH");
      if (bVar4) {
        cmsys::SystemTools::GetRealPath(&local_50,&result,(string *)0x0);
        std::__cxx11::string::operator=((string *)&result,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      goto LAB_00305378;
    }
    while( true ) {
      uVar9 = (uint)uVar8;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar8)
      break;
      bVar4 = std::operator==(pbVar1 + uVar8,"PROGRAM_ARGS");
      if ((bVar4) &&
         (uVar9 = uVar9 + 1,
         (ulong)uVar9 <
         (ulong)((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5))) {
        std::__cxx11::string::_M_assign((string *)&storeArgs);
      }
      uVar8 = (ulong)(uVar9 + 1);
    }
    cmsys::SystemTools::SplitProgramFromArgs(&filename,&result,&programArgs);
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if ((uVar8 < 0x61) ||
     (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)pbVar1 + (uVar8 - 0x20)),"CACHE"),
     _Var3 = programArgs._M_dataplus, !bVar4)) {
    if ((programArgs._M_string_length != 0) && (storeArgs._M_string_length != 0)) {
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,&storeArgs,programArgs._M_dataplus._M_p);
    }
    bVar4 = true;
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,result._M_dataplus._M_p);
  }
  else {
    if ((programArgs._M_string_length != 0) && (storeArgs._M_string_length != 0)) {
      pcVar2 = (this->super_cmCommand).Makefile;
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"PATH");
      cmMakefile::AddCacheDefinition(pcVar2,&storeArgs,_Var3._M_p,"",bVar4 ^ STRING,false);
    }
    _Var3._M_p = result._M_dataplus._M_p;
    pcVar2 = (this->super_cmCommand).Makefile;
    name = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    bVar5 = std::operator==(name + 2,"PATH");
    bVar4 = true;
    cmMakefile::AddCacheDefinition(pcVar2,name,_Var3._M_p,"",bVar5 ^ STRING,false);
  }
LAB_0030547f:
  std::__cxx11::string::~string((string *)&programArgs);
  std::__cxx11::string::~string((string *)&storeArgs);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&result);
  return bVar4;
}

Assistant:

bool cmGetFilenameComponentCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 3)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // Check and see if the value has been stored in the cache
  // already, if so use that value
  if(args.size() >= 4 && args[args.size() - 1] == "CACHE")
    {
    const char* cacheValue = this->Makefile->GetDefinition(args[0]);
    if(cacheValue && !cmSystemTools::IsNOTFOUND(cacheValue))
      {
      return true;
      }
    }

  std::string result;
  std::string filename = args[1];
  if(filename.find("[HKEY") != filename.npos)
    {
    // Check the registry as the target application would view it.
    cmSystemTools::KeyWOW64 view = cmSystemTools::KeyWOW64_32;
    cmSystemTools::KeyWOW64 other_view = cmSystemTools::KeyWOW64_64;
    if(this->Makefile->PlatformIs64Bit())
      {
      view = cmSystemTools::KeyWOW64_64;
      other_view = cmSystemTools::KeyWOW64_32;
      }
    cmSystemTools::ExpandRegistryValues(filename, view);
    if(filename.find("/registry") != filename.npos)
      {
      std::string other = args[1];
      cmSystemTools::ExpandRegistryValues(other, other_view);
      if(other.find("/registry") == other.npos)
        {
        filename = other;
        }
      }
    }
  std::string storeArgs;
  std::string programArgs;
  if (args[2] == "DIRECTORY" || args[2] == "PATH")
    {
    result = cmSystemTools::GetFilenamePath(filename);
    }
  else if (args[2] == "NAME")
    {
    result = cmSystemTools::GetFilenameName(filename);
    }
  else if (args[2] == "PROGRAM")
    {
    for(unsigned int i=2; i < args.size(); ++i)
      {
      if(args[i] == "PROGRAM_ARGS")
        {
        i++;
        if(i < args.size())
          {
          storeArgs = args[i];
          }
        }
      }
    cmSystemTools::SplitProgramFromArgs(filename,
                                        result, programArgs);
    }
  else if (args[2] == "EXT")
    {
    result = cmSystemTools::GetFilenameExtension(filename);
    }
  else if (args[2] == "NAME_WE")
    {
    result = cmSystemTools::GetFilenameWithoutExtension(filename);
    }
  else if (args[2] == "ABSOLUTE" ||
           args[2] == "REALPATH")
    {
    // If the path given is relative, evaluate it relative to the
    // current source directory unless the user passes a different
    // base directory.
    std::string baseDir = this->Makefile->GetCurrentSourceDirectory();
    for(unsigned int i=3; i < args.size(); ++i)
      {
      if(args[i] == "BASE_DIR")
        {
        ++i;
        if(i < args.size())
          {
          baseDir = args[i];
          }
        }
      }
    // Collapse the path to its simplest form.
    result = cmSystemTools::CollapseFullPath(filename, baseDir);
    if(args[2] == "REALPATH")
      {
      // Resolve symlinks if possible
      result = cmSystemTools::GetRealPath(result);
      }
    }
  else
    {
    std::string err = "unknown component " + args[2];
    this->SetError(err);
    return false;
    }

  if(args.size() >= 4 && args[args.size() - 1] == "CACHE")
    {
    if(!programArgs.empty() && !storeArgs.empty())
      {
      this->Makefile->AddCacheDefinition
        (storeArgs, programArgs.c_str(),
         "", args[2] == "PATH" ? cmState::FILEPATH
         : cmState::STRING);
      }
    this->Makefile->AddCacheDefinition
      (args[0], result.c_str(), "",
       args[2] == "PATH" ? cmState::FILEPATH
       : cmState::STRING);
    }
  else
    {
    if(!programArgs.empty() && !storeArgs.empty())
      {
      this->Makefile->AddDefinition(storeArgs, programArgs.c_str());
      }
    this->Makefile->AddDefinition(args[0], result.c_str());
    }

  return true;
}